

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O3

void duckdb::
     LeastGreatestFunction<duckdb::hugeint_t,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  reference pvVar5;
  ulong uVar6;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  size_type sVar10;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  long *local_880;
  long local_878;
  long local_870;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_860;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_840;
  bool local_838 [2056];
  
  if (*(long *)(args + 8) - *(long *)args == 0x68) {
    vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
    duckdb::Vector::Reference(result);
    return;
  }
  if (*(long *)(args + 8) == *(long *)args) {
    memset(local_838,0,0x800);
  }
  else {
    sVar10 = 0;
    do {
      vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,sVar10);
      sVar10 = sVar10 + 1;
      lVar1 = *(long *)args;
      lVar2 = *(long *)(args + 8);
    } while (sVar10 < (ulong)((lVar2 - lVar1 >> 3) * 0x4ec4ec4ec4ec4ec5));
    lVar3 = *(long *)(result + 0x20);
    memset(local_838,0,0x800);
    if (lVar2 != lVar1) {
      sVar10 = 0;
      do {
        pvVar5 = vector<duckdb::Vector,_true>::operator[]
                           ((vector<duckdb::Vector,_true> *)args,sVar10);
        if (*pvVar5 == (value_type)0x2) {
          pvVar5 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)args,sVar10);
          if ((*(byte **)(pvVar5 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar5 + 0x28) & 1) != 0))
          goto LAB_006745a6;
        }
        else {
LAB_006745a6:
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_880);
          pvVar5 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)args,sVar10);
          duckdb::Vector::ToUnifiedFormat((ulong)pvVar5,*(UnifiedVectorFormat **)(args + 0x18));
          uVar6 = *(ulong *)(args + 0x18);
          if (local_870 == 0) {
            if (uVar6 != 0) {
              lVar1 = *local_880;
              uVar8 = 0;
              plVar7 = (long *)(lVar3 + 8);
              do {
                uVar9 = uVar8;
                if (lVar1 != 0) {
                  uVar9 = (ulong)*(uint *)(lVar1 + uVar8 * 4);
                }
                uVar4 = *(ulong *)(local_878 + uVar9 * 0x10);
                lVar2 = *(long *)(local_878 + 8 + uVar9 * 0x10);
                if (local_838[uVar8] == true) {
                  if ((*plVar7 < lVar2) || ((ulong)plVar7[-1] < uVar4 && lVar2 == *plVar7))
                  goto LAB_006746c9;
                }
                else {
LAB_006746c9:
                  local_838[uVar8] = true;
                  plVar7[-1] = uVar4;
                  *plVar7 = lVar2;
                  uVar6 = *(ulong *)(args + 0x18);
                }
                uVar8 = uVar8 + 1;
                plVar7 = plVar7 + 2;
              } while (uVar8 < uVar6);
            }
          }
          else if (uVar6 != 0) {
            lVar1 = *local_880;
            uVar8 = 0;
            plVar7 = (long *)(lVar3 + 8);
            do {
              uVar9 = uVar8;
              if (lVar1 != 0) {
                uVar9 = (ulong)*(uint *)(lVar1 + uVar8 * 4);
              }
              if ((*(ulong *)(local_870 + (uVar9 >> 6) * 8) >> (uVar9 & 0x3f) & 1) != 0) {
                uVar4 = *(ulong *)(local_878 + uVar9 * 0x10);
                lVar2 = *(long *)(local_878 + 8 + uVar9 * 0x10);
                if (local_838[uVar8] == true) {
                  if ((lVar2 <= *plVar7) && (uVar4 <= (ulong)plVar7[-1] || lVar2 != *plVar7))
                  goto LAB_00674661;
                }
                local_838[uVar8] = true;
                plVar7[-1] = uVar4;
                *plVar7 = lVar2;
                uVar6 = *(ulong *)(args + 0x18);
              }
LAB_00674661:
              uVar8 = uVar8 + 1;
              plVar7 = plVar7 + 2;
            } while (uVar8 < uVar6);
          }
          if (local_840 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_840);
          }
          if (local_860 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_860);
          }
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 < (ulong)((*(long *)(args + 8) - *(long *)args >> 3) * 0x4ec4ec4ec4ec4ec5));
    }
  }
  StandardLeastGreatest<false>::FinalizeResult(*(idx_t *)(args + 0x18),local_838,result,state);
  duckdb::Vector::SetVectorType((VectorType)result);
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}